

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pack_unpack.c
# Opt level: O1

void next_token(scanner_t *s)

{
  size_t sVar1;
  undefined7 uVar2;
  byte *pbVar3;
  int iVar4;
  ulong uVar5;
  token_t *ptVar6;
  
  uVar2 = *(undefined7 *)&(s->token).field_0x11;
  (s->prev_token).token = (s->token).token;
  *(undefined7 *)&(s->prev_token).field_0x11 = uVar2;
  iVar4 = (s->token).column;
  sVar1 = (s->token).pos;
  (s->prev_token).line = (s->token).line;
  (s->prev_token).column = iVar4;
  (s->prev_token).pos = sVar1;
  if ((s->next_token).line == 0) {
    if (((s->token).token != '\0') || (*s->fmt != '\0')) {
      pbVar3 = (byte *)s->fmt;
      s->column = s->column + 1;
      s->pos = s->pos + 1;
      while( true ) {
        uVar5 = (ulong)*pbVar3;
        if (0x3a < uVar5) break;
        if ((0x400100100000200U >> (uVar5 & 0x3f) & 1) == 0) {
          if (uVar5 != 10) break;
          s->line = s->line + 1;
          iVar4 = 1;
        }
        else {
          iVar4 = s->column + 1;
        }
        s->column = iVar4;
        s->pos = s->pos + 1;
        pbVar3 = pbVar3 + 1;
      }
      (s->token).token = *pbVar3;
      iVar4 = s->column;
      sVar1 = s->pos;
      (s->token).line = s->line;
      (s->token).column = iVar4;
      (s->token).pos = sVar1;
      s->fmt = (char *)(pbVar3 + (*pbVar3 != 0));
      return;
    }
  }
  else {
    ptVar6 = &s->next_token;
    uVar2 = *(undefined7 *)&(s->next_token).field_0x11;
    (s->token).token = (s->next_token).token;
    *(undefined7 *)&(s->token).field_0x11 = uVar2;
    iVar4 = ptVar6->column;
    sVar1 = (s->next_token).pos;
    (s->token).line = ptVar6->line;
    (s->token).column = iVar4;
    (s->token).pos = sVar1;
    ptVar6->line = 0;
  }
  return;
}

Assistant:

static void next_token(scanner_t *s) {
    const char *t;
    s->prev_token = s->token;

    if (s->next_token.line) {
        s->token = s->next_token;
        s->next_token.line = 0;
        return;
    }

    if (!token(s) && !*s->fmt)
        return;

    t = s->fmt;
    s->column++;
    s->pos++;

    /* skip space and ignored chars */
    while (*t == ' ' || *t == '\t' || *t == '\n' || *t == ',' || *t == ':') {
        if (*t == '\n') {
            s->line++;
            s->column = 1;
        } else
            s->column++;

        s->pos++;
        t++;
    }

    s->token.token = *t;
    s->token.line = s->line;
    s->token.column = s->column;
    s->token.pos = s->pos;

    if (*t)
        t++;
    s->fmt = t;
}